

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O0

bool __thiscall nuraft::raft_server::check_snapshot_timeout(raft_server *this,ptr<peer> *pp)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  element_type *peVar4;
  element_type *peVar5;
  uint64_t uVar6;
  element_type *peVar7;
  peer *in_RSI;
  raft_server *in_RDI;
  ptr<snapshot_sync_ctx> sync_ctx;
  timer_helper *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  timer_helper *in_stack_ffffffffffffffa0;
  timer_helper *in_stack_ffffffffffffffa8;
  __shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2> local_28;
  raft_server *this_00;
  bool local_1;
  
  this_00 = in_RDI;
  std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1ab0eb
            );
  peer::get_snapshot_sync_ctx((peer *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
  ;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_28);
  if (bVar1) {
    peVar4 = std::
             __shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1ab12e);
    snapshot_sync_ctx::get_timer(peVar4);
    bVar1 = timer_helper::timeout(in_stack_ffffffffffffffa8);
    if (bVar1) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
      if (bVar1) {
        peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1ab185);
        iVar2 = (**(code **)(*(long *)peVar5 + 0x38))();
        if (2 < iVar2) {
          peVar5 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1ab1b5);
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1ab1c4);
          uVar3 = peer::get_id((peer *)0x1ab1cc);
          peVar4 = std::
                   __shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1ab1df);
          in_stack_ffffffffffffff60 = snapshot_sync_ctx::get_timer(peVar4);
          uVar6 = timer_helper::get_ms(in_stack_ffffffffffffffa0);
          peVar7 = std::__shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>::get
                             (&local_28);
          msg_if_given_abi_cxx11_
                    (&stack0xffffffffffffffa0,
                     "snapshot install task for peer %d timed out: %lu ms, reset snapshot sync context %p"
                     ,(ulong)uVar3,uVar6,peVar7);
          (**(code **)(*(long *)peVar5 + 0x40))
                    (peVar5,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                     ,"check_snapshot_timeout",0x32,&stack0xffffffffffffffa0);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
        }
      }
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 in_stack_ffffffffffffff60);
      clear_snapshot_sync_ctx(this_00,in_RSI);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  std::shared_ptr<nuraft::snapshot_sync_ctx>::~shared_ptr
            ((shared_ptr<nuraft::snapshot_sync_ctx> *)0x1ab2d7);
  return local_1;
}

Assistant:

bool raft_server::check_snapshot_timeout(ptr<peer> pp) {
    ptr<snapshot_sync_ctx> sync_ctx = pp->get_snapshot_sync_ctx();
    if (!sync_ctx) return false;

    if ( sync_ctx->get_timer().timeout() ) {
        p_wn("snapshot install task for peer %d timed out: %" PRIu64 " ms, "
             "reset snapshot sync context %p",
             pp->get_id(), sync_ctx->get_timer().get_ms(), sync_ctx.get());
        clear_snapshot_sync_ctx(*pp);
        return true;
    }
    return false;
}